

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-png.hxx
# Opt level: O2

void andres::png::save<unsigned_char>
               (string *fileName,Marray<unsigned_char,_std::allocator<unsigned_long>_> *in)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  __jmp_buf_tag *p_Var5;
  size_t sVar6;
  reference puVar7;
  size_t *begin;
  size_t *end;
  runtime_error *prVar8;
  size_t y;
  unsigned_long args;
  allocator_type local_c1;
  undefined4 local_c0;
  undefined4 local_bc;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rowPointers;
  CoordinateOrder local_80;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> local_70;
  
  sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if (sVar2 == 2) {
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                      (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
    if ((sVar2 >> 0x20 == 0) &&
       (sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1),
       sVar2 >> 0x20 == 0)) {
      View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
      if ((in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
          coordinateOrder_ == FirstMajorOrder) {
        begin = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeBegin
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        end = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeEnd
                        (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        local_70.data_._0_1_ = 1;
        Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
                  ((Marray<unsigned_char,std::allocator<unsigned_long>> *)&rowPointers,begin,end,
                   (uchar *)&local_70,&defaultOrder,&local_c1);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
                  (&local_70,
                   (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&rowPointers);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
                  (&local_70,&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70.geometry_);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&rowPointers);
        if (local_80 == LastMajorOrder) {
          save<unsigned_char>(fileName,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)
                                       &rowPointers);
          Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
                    ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)&rowPointers);
          return;
        }
        __assert_fail("tmp.coordinateOrder() == LastMajorOrder",
                      "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-png.hxx"
                      ,0x83,
                      "void andres::png::save(const std::string &, const Marray<unsigned char> &)");
      }
      View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
      if ((in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
          coordinateOrder_ != LastMajorOrder) {
        __assert_fail("in.coordinateOrder() == LastMajorOrder",
                      "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-png.hxx"
                      ,0x88,
                      "void andres::png::save(const std::string &, const Marray<unsigned char> &)");
      }
      __stream = fopen((fileName->_M_dataplus)._M_p,"wb");
      if (__stream == (FILE *)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"could not open PNG file for writing");
      }
      else {
        lVar3 = png_create_write_struct("1.6.37",0,0);
        if (lVar3 == 0) {
          fclose(__stream);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"png_create_write_struct failed");
        }
        else {
          lVar4 = png_create_info_struct(lVar3);
          if (lVar4 == 0) {
            fclose(__stream);
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,"png_create_info_struct failed");
          }
          else {
            p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar3,longjmp,200);
            iVar1 = _setjmp(p_Var5);
            if (iVar1 == 0) {
              png_init_io(lVar3,__stream);
              p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar3,longjmp,200);
              iVar1 = _setjmp(p_Var5);
              if (iVar1 == 0) {
                sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                                  (&in->
                                    super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                   ,0);
                sVar6 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                                  (&in->
                                    super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                   ,1);
                local_bc = (undefined4)sVar6;
                std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
                          (&rowPointers,sVar6 & 0xffffffff,(allocator_type *)&local_70);
                local_c0 = (undefined4)sVar2;
                for (args = 0; (sVar6 & 0xffffffff) != args; args = args + 1) {
                  puVar7 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)in,
                                      0,args);
                  rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[args] = puVar7;
                }
                png_set_IHDR(lVar3,lVar4,local_c0,local_bc,8,0,0,0,0);
                png_write_info(lVar3,lVar4);
                p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar3,longjmp,200);
                iVar1 = _setjmp(p_Var5);
                if (iVar1 == 0) {
                  png_write_image(lVar3,rowPointers.
                                        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                  p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar3,longjmp,200);
                  iVar1 = _setjmp(p_Var5);
                  if (iVar1 == 0) {
                    png_write_end(lVar3,0);
                    fclose(__stream);
                    std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::
                    ~_Vector_base(&rowPointers.
                                   super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                 );
                    return;
                  }
                  fclose(__stream);
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar8,"Error during end of write");
                }
                else {
                  fclose(__stream);
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar8,"Error during writing bytes");
                }
                __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              fclose(__stream);
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"error during writing PNG header");
            }
            else {
              fclose(__stream);
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"error during init_io");
            }
          }
        }
      }
    }
    else {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"marray is too large for export to PNG");
    }
  }
  else {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar8,"not implemented for Marray of dimension other than 2.");
  }
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
save(
    std::string const & fileName,
    Marray<unsigned char> const & in
) {
    if(in.dimension() != 2) {
        throw std::runtime_error("not implemented for Marray of dimension other than 2.");
    }
    if(in.shape(0) > std::numeric_limits<png_uint_32>::max()
    || in.shape(1) > std::numeric_limits<png_uint_32>::max()) {
        throw std::runtime_error("marray is too large for export to PNG");
    }
    if(in.coordinateOrder() == FirstMajorOrder) {
        Marray<unsigned char> tmp(in.shapeBegin(), in.shapeEnd(), LastMajorOrder);
        // note: tmp = in; would change in.coordinateOrder() which we do not want. thus:
        static_cast<andres::View<unsigned char, false> >(tmp) = in; // re-order in memory
        assert(tmp.coordinateOrder() == LastMajorOrder);
        save(fileName, tmp); // recurse!
        return;
    }

    assert(in.coordinateOrder() == LastMajorOrder);

    FILE *file = std::fopen(fileName.c_str(), "wb");
    if(!file) {
        throw std::runtime_error("could not open PNG file for writing");
    }
    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
    if (!png_ptr) {
        fclose(file);
        throw std::runtime_error("png_create_write_struct failed");
    }
    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        fclose(file);
        throw std::runtime_error("png_create_info_struct failed");
    }
    if(setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("error during init_io");
    }
    png_init_io(png_ptr, file);
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("error during writing PNG header");
    }

    png_uint_32 const width = static_cast<png_uint_32>(in.shape(0)); // bound has been checked before
    png_uint_32 const height = static_cast<png_uint_32>(in.shape(1)); // bound has been checked before
    std::vector<png_bytep> rowPointers(height);
    for(size_t y = 0; y < height; ++y) {
        rowPointers[y] = &in(0, y);
    }
    png_byte const color_type = PNG_COLOR_TYPE_GRAY;
    png_byte const bit_depth = 8;
    png_set_IHDR(
        png_ptr,
        info_ptr,
        width,
        height,
        bit_depth,
        color_type,
        PNG_INTERLACE_NONE,
        PNG_COMPRESSION_TYPE_BASE,
        PNG_FILTER_TYPE_BASE
    );
    png_write_info(png_ptr, info_ptr);
    // write bytes
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("Error during writing bytes");
    }
    png_write_image(png_ptr, rowPointers.data());
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("Error during end of write");
    }
    png_write_end(png_ptr, nullptr);
    fclose(file);
}